

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_setup_conn(connectdata *conn)

{
  void *pvVar1;
  HTTP *http;
  connectdata *conn_local;
  
  pvVar1 = (*Curl_ccalloc)(1,0x228);
  if (pvVar1 == (void *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_mime_initpart((curl_mimepart *)((long)pvVar1 + 0x38),conn->data);
    (conn->data->req).protop = pvVar1;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_http_setup_conn(struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  struct HTTP *http;
  DEBUGASSERT(conn->data->req.protop == NULL);

  http = calloc(1, sizeof(struct HTTP));
  if(!http)
    return CURLE_OUT_OF_MEMORY;

  Curl_mime_initpart(&http->form, conn->data);
  conn->data->req.protop = http;

  Curl_http2_setup_conn(conn);
  Curl_http2_setup_req(conn->data);

  return CURLE_OK;
}